

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::
statement_inner<char_const(&)[27],unsigned_int&,char_const(&)[24],unsigned_int&,char_const(&)[24],unsigned_int&,char_const(&)[4]>
          (CompilerGLSL *this,char (*t) [27],uint *ts,char (*ts_1) [24],uint *ts_2,char (*ts_3) [24]
          ,uint *ts_4,char (*ts_5) [4])

{
  StringStream<4096UL,_4096UL>::operator<<(&this->buffer,*t);
  this->statement_count = this->statement_count + 1;
  statement_inner<unsigned_int&,char_const(&)[24],unsigned_int&,char_const(&)[24],unsigned_int&,char_const(&)[4]>
            (this,ts,ts_1,ts_2,ts_3,ts_4,ts_5);
  return;
}

Assistant:

inline void statement_inner(T &&t, Ts &&... ts)
	{
		buffer << std::forward<T>(t);
		statement_count++;
		statement_inner(std::forward<Ts>(ts)...);
	}